

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_detect_idle_stream(nghttp2_session *session,int32_t stream_id)

{
  uint uVar1;
  
  if ((stream_id != 0) && (((session->server == '\0' ^ (byte)stream_id) & 1) == 0)) {
    return (int)(session->last_sent_stream_id < stream_id);
  }
  uVar1 = 0;
  if ((stream_id != 0) && ((session->server == '\0') != (bool)((byte)stream_id & 1))) {
    uVar1 = (uint)(session->last_recv_stream_id < stream_id);
  }
  return uVar1;
}

Assistant:

static int session_detect_idle_stream(nghttp2_session *session,
                                      int32_t stream_id) {
  /* Assume that stream object with stream_id does not exist */
  if (nghttp2_session_is_my_stream_id(session, stream_id)) {
    if (session->last_sent_stream_id < stream_id) {
      return 1;
    }
    return 0;
  }
  if (session_is_new_peer_stream_id(session, stream_id)) {
    return 1;
  }
  return 0;
}